

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2Impl::recompose
          (Normalizer2Impl *this,ReorderingBuffer *buffer,int32_t recomposeStartIndex,
          UBool onlyContiguous)

{
  UChar UVar1;
  ushort uVar2;
  UCPTrie *trie;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  UChar *pUVar7;
  ulong uVar8;
  ushort uVar9;
  UChar *pUVar10;
  UChar *pUVar11;
  ushort *puVar12;
  UChar *pUVar13;
  UChar *pUVar14;
  uint uVar15;
  uint16_t *list;
  uint uVar16;
  uint16_t *puVar17;
  uint c;
  UChar *pUVar18;
  
  pUVar11 = buffer->start + recomposeStartIndex;
  pUVar13 = buffer->limit;
  if (pUVar11 == pUVar13) {
    return;
  }
  uVar16 = 0;
  bVar3 = false;
  puVar12 = (ushort *)0x0;
  list = (uint16_t *)0x0;
  do {
    pUVar7 = pUVar11;
    uVar15 = uVar16;
LAB_00297337:
    pUVar11 = pUVar7 + 1;
    UVar1 = *pUVar7;
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if (((((ushort)UVar1 >> 10 & 1) == 0) && (pUVar11 != pUVar13)) &&
         (UVar1 = *pUVar11, ((ushort)UVar1 & 0xfc00) == 0xdc00)) {
        pUVar11 = pUVar7 + 2;
        c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
        trie = this->normTrie;
        if ((int)c < trie->highStart) {
          iVar5 = ucptrie_internalSmallIndex_63(trie,c);
        }
        else {
          iVar5 = trie->dataLength + -2;
        }
      }
      else {
        iVar5 = this->normTrie->dataLength + -1;
      }
    }
    else {
      iVar5 = (c & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
    }
    uVar9 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar5 * 2);
    uVar16 = 0;
    if (0xfbff < uVar9) {
      uVar16 = (uint)(uVar9 >> 1);
    }
    uVar2 = this->minMaybeYes;
    pUVar7 = pUVar11;
    pUVar14 = pUVar13;
    if (((uVar9 < 0xfe01) && (uVar2 <= uVar9)) &&
       ((list != (uint16_t *)0x0 && ((byte)uVar15 == 0 || (byte)uVar15 < (byte)uVar16)))) {
      if (uVar9 == 0xfe00) {
        if (((int)c < 0x11a7) && ((ushort)(*puVar12 + 0xef00) < 0x13)) {
          uVar9 = ((short)c + (*puVar12 + 0xef00) * 0x15) * 0x1c + 0xc564;
          if ((pUVar11 != pUVar13) && ((ushort)(*pUVar11 + L'\xee59') < 0x1c)) {
            uVar9 = *pUVar11 + L'\xee59' + uVar9;
            pUVar7 = pUVar11 + 1;
          }
          pUVar11 = pUVar11 + -1;
          *puVar12 = uVar9;
          pUVar14 = pUVar11;
          for (; pUVar7 < pUVar13; pUVar7 = pUVar7 + 1) {
            *pUVar14 = *pUVar7;
            pUVar14 = pUVar14 + 1;
          }
        }
        list = (uint16_t *)0x0;
        pUVar13 = pUVar14;
        pUVar7 = pUVar11;
        if (pUVar11 == pUVar14) goto LAB_00297745;
        goto LAB_00297337;
      }
      uVar6 = combine(list,c);
      if (-1 < (int)uVar6) {
        uVar16 = uVar6 >> 1;
        uVar8 = (ulong)(c < 0x10000) | 0xfffffffffffffffe;
        pUVar18 = pUVar11 + uVar8;
        uVar9 = (ushort)uVar16;
        if (bVar3) {
          if (uVar16 - 0x10000 < 0x100000) {
            *puVar12 = (short)(uVar6 >> 0xb) + 0xd7c0;
            puVar12[1] = uVar9 & 0x3ff | 0xdc00;
LAB_002975c1:
            bVar3 = true;
          }
          else {
            *puVar12 = uVar9;
            if (puVar12 + 2 < pUVar18) {
              pUVar10 = pUVar11 + uVar8;
              if (pUVar11 + uVar8 <= puVar12 + 3) {
                pUVar10 = (UChar *)(puVar12 + 3);
              }
              memmove(puVar12 + 1,puVar12 + 2,
                      ((long)pUVar10 + (-5 - (long)puVar12) & 0xfffffffffffffffeU) + 2);
            }
            pUVar18 = pUVar18 + -1;
            bVar3 = false;
          }
        }
        else {
          pUVar10 = pUVar18;
          if (uVar16 - 0x10000 < 0x100000) {
            for (; puVar12 + 1 < pUVar10; pUVar10 = pUVar10 + -1) {
              *pUVar10 = pUVar10[-1];
            }
            pUVar18 = pUVar18 + 1;
            puVar12[1] = uVar9 & 0x3ff | 0xdc00;
            *puVar12 = (short)(uVar6 >> 0xb) + 0xd7c0;
            goto LAB_002975c1;
          }
          *puVar12 = uVar9;
          bVar3 = false;
        }
        pUVar10 = pUVar18;
        if (pUVar18 < pUVar11) {
          for (; pUVar14 = pUVar10, pUVar7 = pUVar18, pUVar11 < pUVar13; pUVar11 = pUVar11 + 1) {
            *pUVar14 = *pUVar11;
            pUVar10 = pUVar14 + 1;
          }
        }
        if (pUVar7 != pUVar14) {
          if ((uVar6 & 1) == 0) {
            list = (uint16_t *)0x0;
          }
          else {
            uVar4 = getRawNorm16(this,uVar16);
            list = (uint16_t *)
                   ((long)this->extraData +
                   (ulong)(*(ushort *)((long)this->extraData + (ulong)(uVar4 & 0xfffe)) & 0x1f) * 2
                   + (ulong)(uVar4 & 0xfffe) + 2);
          }
        }
        pUVar13 = pUVar14;
        uVar15 = uVar15 & 0xff;
        if (pUVar7 == pUVar14) goto LAB_00297745;
        goto LAB_00297337;
      }
    }
    if (pUVar11 == pUVar13) {
LAB_00297745:
      buffer->remainingCapacity =
           buffer->remainingCapacity + (int)((ulong)((long)buffer->limit - (long)pUVar14) >> 1);
      buffer->limit = pUVar14;
      buffer->reorderStart = pUVar14;
      buffer->lastCC = '\0';
      return;
    }
    uVar15 = uVar16;
    if ((byte)uVar16 != 0) {
      if (onlyContiguous != '\0') {
        list = (uint16_t *)0x0;
      }
      goto LAB_00297337;
    }
    if ((ushort)(uVar9 + 0x400) < 0x402) {
      puVar17 = (uint16_t *)0x0;
    }
    else if (uVar9 < uVar2) {
      puVar17 = (uint16_t *)((ulong)((uint)(uVar9 >> 1) * 2) + (long)this->extraData);
    }
    else {
      puVar17 = (uint16_t *)
                ((long)this->maybeYesCompositions + ((ulong)uVar9 * 2 - (ulong)((uint)uVar2 * 2)));
    }
    list = (uint16_t *)0x0;
    if (puVar17 == (uint16_t *)0x0) goto LAB_00297337;
    bVar3 = c >= 0x10000;
    puVar12 = (ushort *)(((ulong)((uint)(c < 0x10000) * 2) | 0xfffffffffffffffc) + (long)pUVar11);
    list = puVar17;
  } while( true );
}

Assistant:

void Normalizer2Impl::recompose(ReorderingBuffer &buffer, int32_t recomposeStartIndex,
                                UBool onlyContiguous) const {
    UChar *p=buffer.getStart()+recomposeStartIndex;
    UChar *limit=buffer.getLimit();
    if(p==limit) {
        return;
    }

    UChar *starter, *pRemove, *q, *r;
    const uint16_t *compositionsList;
    UChar32 c, compositeAndFwd;
    uint16_t norm16;
    uint8_t cc, prevCC;
    UBool starterIsSupplementary;

    // Some of the following variables are not used until we have a forward-combining starter
    // and are only initialized now to avoid compiler warnings.
    compositionsList=NULL;  // used as indicator for whether we have a forward-combining starter
    starter=NULL;
    starterIsSupplementary=FALSE;
    prevCC=0;

    for(;;) {
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        cc=getCCFromYesOrMaybe(norm16);
        if( // this character combines backward and
            isMaybe(norm16) &&
            // we have seen a starter that combines forward and
            compositionsList!=NULL &&
            // the backward-combining character is not blocked
            (prevCC<cc || prevCC==0)
        ) {
            if(isJamoVT(norm16)) {
                // c is a Jamo V/T, see if we can compose it with the previous character.
                if(c<Hangul::JAMO_T_BASE) {
                    // c is a Jamo Vowel, compose with previous Jamo L and following Jamo T.
                    UChar prev=(UChar)(*starter-Hangul::JAMO_L_BASE);
                    if(prev<Hangul::JAMO_L_COUNT) {
                        pRemove=p-1;
                        UChar syllable=(UChar)
                            (Hangul::HANGUL_BASE+
                             (prev*Hangul::JAMO_V_COUNT+(c-Hangul::JAMO_V_BASE))*
                             Hangul::JAMO_T_COUNT);
                        UChar t;
                        if(p!=limit && (t=(UChar)(*p-Hangul::JAMO_T_BASE))<Hangul::JAMO_T_COUNT) {
                            ++p;
                            syllable+=t;  // The next character was a Jamo T.
                        }
                        *starter=syllable;
                        // remove the Jamo V/T
                        q=pRemove;
                        r=p;
                        while(r<limit) {
                            *q++=*r++;
                        }
                        limit=q;
                        p=pRemove;
                    }
                }
                /*
                 * No "else" for Jamo T:
                 * Since the input is in NFD, there are no Hangul LV syllables that
                 * a Jamo T could combine with.
                 * All Jamo Ts are combined above when handling Jamo Vs.
                 */
                if(p==limit) {
                    break;
                }
                compositionsList=NULL;
                continue;
            } else if((compositeAndFwd=combine(compositionsList, c))>=0) {
                // The starter and the combining mark (c) do combine.
                UChar32 composite=compositeAndFwd>>1;

                // Replace the starter with the composite, remove the combining mark.
                pRemove=p-U16_LENGTH(c);  // pRemove & p: start & limit of the combining mark
                if(starterIsSupplementary) {
                    if(U_IS_SUPPLEMENTARY(composite)) {
                        // both are supplementary
                        starter[0]=U16_LEAD(composite);
                        starter[1]=U16_TRAIL(composite);
                    } else {
                        *starter=(UChar)composite;
                        // The composite is shorter than the starter,
                        // move the intermediate characters forward one.
                        starterIsSupplementary=FALSE;
                        q=starter+1;
                        r=q+1;
                        while(r<pRemove) {
                            *q++=*r++;
                        }
                        --pRemove;
                    }
                } else if(U_IS_SUPPLEMENTARY(composite)) {
                    // The composite is longer than the starter,
                    // move the intermediate characters back one.
                    starterIsSupplementary=TRUE;
                    ++starter;  // temporarily increment for the loop boundary
                    q=pRemove;
                    r=++pRemove;
                    while(starter<q) {
                        *--r=*--q;
                    }
                    *starter=U16_TRAIL(composite);
                    *--starter=U16_LEAD(composite);  // undo the temporary increment
                } else {
                    // both are on the BMP
                    *starter=(UChar)composite;
                }

                /* remove the combining mark by moving the following text over it */
                if(pRemove<p) {
                    q=pRemove;
                    r=p;
                    while(r<limit) {
                        *q++=*r++;
                    }
                    limit=q;
                    p=pRemove;
                }
                // Keep prevCC because we removed the combining mark.

                if(p==limit) {
                    break;
                }
                // Is the composite a starter that combines forward?
                if(compositeAndFwd&1) {
                    compositionsList=
                        getCompositionsListForComposite(getRawNorm16(composite));
                } else {
                    compositionsList=NULL;
                }

                // We combined; continue with looking for compositions.
                continue;
            }
        }

        // no combination this time
        prevCC=cc;
        if(p==limit) {
            break;
        }

        // If c did not combine, then check if it is a starter.
        if(cc==0) {
            // Found a new starter.
            if((compositionsList=getCompositionsListForDecompYes(norm16))!=NULL) {
                // It may combine with something, prepare for it.
                if(U_IS_BMP(c)) {
                    starterIsSupplementary=FALSE;
                    starter=p-1;
                } else {
                    starterIsSupplementary=TRUE;
                    starter=p-2;
                }
            }
        } else if(onlyContiguous) {
            // FCC: no discontiguous compositions; any intervening character blocks.
            compositionsList=NULL;
        }
    }
    buffer.setReorderingLimit(limit);
}